

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_transfer(CURLM *multi)

{
  timeval older;
  bool bVar1;
  long lVar2;
  CURLMsg *pCVar3;
  int local_80;
  CURLMsg *msg;
  int rc;
  int sleep_ms;
  timeval after;
  __suseconds_t local_50;
  int local_44;
  int local_40;
  int ret;
  int still_running;
  int without_fds;
  timeval before;
  CURLMcode local_20;
  CURLcode result;
  CURLMcode mcode;
  _Bool done;
  CURLM *multi_local;
  
  bVar1 = false;
  local_20 = CURLM_OK;
  before.tv_usec._4_4_ = CURLE_OK;
  ret = 0;
  do {
    if (bVar1 || local_20 != CURLM_OK) {
LAB_0087f3e0:
      if (local_20 == CURLM_OK) {
        multi_local._4_4_ = before.tv_usec._4_4_;
      }
      else {
        multi_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
        if (local_20 == CURLM_OUT_OF_MEMORY) {
          multi_local._4_4_ = CURLE_OUT_OF_MEMORY;
        }
      }
      return multi_local._4_4_;
    }
    local_40 = 0;
    join_0x00000010_0x00000000_ = curlx_tvnow();
    _still_running = after.tv_usec;
    before.tv_sec = local_50;
    local_20 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_44);
    if (local_20 == CURLM_OK) {
      if (local_44 == -1) {
        before.tv_usec._4_4_ = CURLE_RECV_ERROR;
        goto LAB_0087f3e0;
      }
      if (local_44 == 0) {
        _rc = curlx_tvnow();
        older.tv_usec = before.tv_sec;
        older.tv_sec = _still_running;
        lVar2 = curlx_tvdiff(_rc,older);
        if (lVar2 < 0xb) {
          ret = ret + 1;
          if (2 < ret) {
            if (ret < 10) {
              local_80 = 1 << ((char)ret - 1U & 0x1f);
            }
            else {
              local_80 = 1000;
            }
            msg._4_4_ = local_80;
            Curl_wait_ms(local_80);
          }
        }
        else {
          ret = 0;
        }
      }
      else {
        ret = 0;
      }
      local_20 = curl_multi_perform(multi,&local_40);
    }
    if (((local_20 == CURLM_OK) && (local_40 == 0)) &&
       (pCVar3 = curl_multi_info_read(multi,(int *)&msg), pCVar3 != (CURLMsg *)0x0)) {
      before.tv_usec._4_4_ = (pCVar3->data).result;
      bVar1 = true;
    }
  } while( true );
}

Assistant:

static CURLcode easy_transfer(CURLM *multi)
{
  bool done = FALSE;
  CURLMcode mcode = CURLM_OK;
  CURLcode result = CURLE_OK;
  struct timeval before;
  int without_fds = 0;  /* count number of consecutive returns from
                           curl_multi_wait() without any filedescriptors */

  while(!done && !mcode) {
    int still_running = 0;
    int ret;

    before = curlx_tvnow();
    mcode = curl_multi_wait(multi, NULL, 0, 1000, &ret);

    if(mcode == CURLM_OK) {
      if(ret == -1) {
        /* poll() failed not on EINTR, indicate a network problem */
        result = CURLE_RECV_ERROR;
        break;
      }
      else if(ret == 0) {
        struct timeval after = curlx_tvnow();
        /* If it returns without any filedescriptor instantly, we need to
           avoid busy-looping during periods where it has nothing particular
           to wait for */
        if(curlx_tvdiff(after, before) <= 10) {
          without_fds++;
          if(without_fds > 2) {
            int sleep_ms = without_fds < 10 ? (1 << (without_fds-1)): 1000;
            Curl_wait_ms(sleep_ms);
          }
        }
        else
          /* it wasn't "instant", restart counter */
          without_fds = 0;
      }
      else
        /* got file descriptor, restart counter */
        without_fds = 0;

      mcode = curl_multi_perform(multi, &still_running);
    }

    /* only read 'still_running' if curl_multi_perform() return OK */
    if((mcode == CURLM_OK) && !still_running) {
      int rc;
      CURLMsg *msg = curl_multi_info_read(multi, &rc);
      if(msg) {
        result = msg->data.result;
        done = TRUE;
      }
    }
  }

  /* Make sure to return some kind of error if there was a multi problem */
  if(mcode) {
    return (mcode == CURLM_OUT_OF_MEMORY) ? CURLE_OUT_OF_MEMORY :
            /* The other multi errors should never happen, so return
               something suitably generic */
            CURLE_BAD_FUNCTION_ARGUMENT;
  }

  return result;
}